

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall lunasvg::SVGRect::parse(SVGRect *this,string_view input)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  byte *pbVar5;
  long lVar6;
  Rect value;
  string_view local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  pbVar5 = (byte *)input._M_str;
  local_28._M_len = input._M_len;
  local_18 = 0;
  uStack_10 = 0;
  local_28._M_str = (char *)pbVar5;
  if (local_28._M_len != 0) {
    pbVar1 = pbVar5 + local_28._M_len;
    lVar4 = -local_28._M_len;
    do {
      if ((0x20 < (ulong)(byte)*local_28._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_28._M_str & 0x3f) & 1) == 0)) {
        lVar6 = 0;
        goto LAB_0011fca9;
      }
      local_28._M_str = (char *)((byte *)local_28._M_str + 1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
    local_28._M_len = 0;
    local_28._M_str = (char *)pbVar1;
  }
  goto LAB_0011fcd1;
  while (bVar2 = lVar4 + 1 != lVar6, lVar6 = lVar6 + -1, bVar2) {
LAB_0011fca9:
    if ((0x20 < (ulong)pbVar5[lVar6 + (local_28._M_len - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar5[lVar6 + (local_28._M_len - 1)] & 0x3f) & 1) == 0)) {
      local_28._M_len = lVar6 - lVar4;
      goto LAB_0011fcd1;
    }
  }
  local_28._M_len = 0;
LAB_0011fcd1:
  bVar2 = parseNumber<float>(&local_28,(float *)&local_18);
  if (((((bVar2) && (bVar2 = skipOptionalSpacesOrDelimiter(&local_28,','), bVar2)) &&
       (bVar2 = parseNumber<float>(&local_28,(float *)((long)&local_18 + 4)), bVar2)) &&
      ((bVar2 = skipOptionalSpacesOrDelimiter(&local_28,','), bVar2 &&
       (bVar2 = parseNumber<float>(&local_28,(float *)&uStack_10), bVar2)))) &&
     (bVar2 = skipOptionalSpacesOrDelimiter(&local_28,','), bVar2)) {
    bVar3 = parseNumber<float>(&local_28,(float *)((long)&uStack_10 + 4));
    bVar2 = false;
    if ((bVar3) && (local_28._M_len == 0)) {
      bVar2 = false;
      if ((0.0 <= (float)uStack_10) && (bVar2 = false, 0.0 <= uStack_10._4_4_)) {
        *(undefined8 *)&(this->super_SVGProperty).field_0xc = local_18;
        *(undefined8 *)&this->field_0x14 = uStack_10;
        bVar2 = true;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SVGRect::parse(std::string_view input)
{
    Rect value;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value.x)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.y)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.w)
        || !skipOptionalSpacesOrComma(input)
        || !parseNumber(input, value.h)
        || !input.empty()) {
        return false;
    }

    if(value.w < 0.f || value.h < 0.f)
        return false;
    m_value = value;
    return true;
}